

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.h
# Opt level: O0

void __thiscall DES::DES(DES *this,SequenceD<64> *key)

{
  SequenceD<64> *key_local;
  DES *this_local;
  
  SequenceD<64>::SequenceD(&this->m_key,key);
  return;
}

Assistant:

explicit DES(SequenceD<64> &key) : m_key(key){}